

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O1

void mzd_rotate_right_uint64_128(mzd_local_t *res,mzd_local_t *val,uint count)

{
  ulong uVar1;
  byte bVar2;
  
  uVar1 = val->w64[0];
  bVar2 = (byte)count & 0x3f;
  res->w64[0] = uVar1 >> bVar2 | val->w64[1] << 0x40 - bVar2;
  bVar2 = (byte)count & 0x3f;
  res->w64[1] = val->w64[1] >> bVar2 | uVar1 << 0x40 - bVar2;
  return;
}

Assistant:

void mzd_rotate_right_uint64_128(mzd_local_t* res, const mzd_local_t* val, unsigned int count) {
  const unsigned int left_count = 8 * sizeof(word) - count;
  const block_t* block          = CONST_BLOCK(val, 0);
  block_t* rblock               = BLOCK(res, 0);

  const word tmp = block->w64[0] << left_count;
  rblock->w64[0] = (block->w64[0] >> count) | (block->w64[1] << left_count);
  rblock->w64[1] = (block->w64[1] >> count) | tmp;
}